

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureCubeFormatCase::init(TextureCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *stream;
  TextureCube *this_00;
  long lVar3;
  int face;
  ulong uVar4;
  TextureFormatInfo spec;
  TextureFormat fmt;
  ostringstream fmtName;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  long local_398 [3];
  TextureFormatInfo local_380;
  TextureFormat local_340;
  undefined1 local_338 [8];
  float afStack_330 [28];
  ios_base local_2c0 [264];
  LogGradientFmt local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_340 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatInfo(&local_380,&local_340);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (this->m_dataType == 0) {
    local_338 = (undefined1  [8])glu::getTextureFormatName;
    afStack_330[0] = (float)this->m_format;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_338,(ostream *)local_1a8);
  }
  else {
    local_338 = (undefined1  [8])glu::getTextureFormatName;
    afStack_330[0] = (float)this->m_format;
    stream = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_338,(ostream *)local_1a8)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
    local_3a8 = (undefined1  [8])glu::getTypeName;
    uStack_3a0 = CONCAT44(uStack_3a0._4_4_,this->m_dataType);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_3a8,stream);
  }
  local_338 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_330);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)afStack_330,"Cube map texture, ",0x12);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)afStack_330,(char *)local_3a8,uStack_3a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)afStack_330,", ",2);
  std::ostream::operator<<((ostringstream *)afStack_330,this->m_width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)afStack_330,"x",1);
  std::ostream::operator<<((ostringstream *)afStack_330,this->m_height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)afStack_330,",\n  fill with ",0xe);
  local_1b8.valueMax = &local_380.valueMax;
  local_1b8.valueMin = &local_380.valueMin;
  glu::TextureTestUtil::operator<<((ostream *)afStack_330,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)afStack_330," gradient",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3a8 != (undefined1  [8])local_398) {
    operator_delete((void *)local_3a8,local_398[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_330);
  std::ios_base::~ios_base(local_2c0);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,this->m_width);
  }
  else {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,dataType,this->m_width);
  }
  this->m_texture = this_00;
  lVar3 = 0xb0;
  uVar4 = 0;
  do {
    local_338 = (undefined1  [8])0x0;
    afStack_330._0_8_ = 0;
    local_3a8 = (undefined1  [8])0x0;
    uStack_3a0._0_4_ = 0.0;
    uStack_3a0._4_4_ = 0.0;
    uStack_3a0._0_4_ = local_380.valueMin.m_data[0];
    uStack_3a0._4_4_ = local_380.valueMin.m_data[3];
    switch(uVar4 & 0xffffffff) {
    case 0:
      local_338 = (undefined1  [8])
                  CONCAT44(local_380.valueMin.m_data[1],local_380.valueMin.m_data[0]);
      afStack_330[1] = local_380.valueMin.m_data[3];
      afStack_330[0] = local_380.valueMin.m_data[2];
      local_3a8 = (undefined1  [8])
                  CONCAT44(local_380.valueMax.m_data[1],local_380.valueMax.m_data[0]);
      uStack_3a0._4_4_ = local_380.valueMax.m_data[3];
      uStack_3a0._0_4_ = local_380.valueMax.m_data[2];
      break;
    case 1:
      local_338._4_4_ = local_380.valueMin.m_data[1];
      local_338._0_4_ = local_380.valueMin.m_data[2];
      afStack_330[1] = local_380.valueMin.m_data[3];
      afStack_330[0] = local_380.valueMin.m_data[0];
      local_3a8._4_4_ = local_380.valueMax.m_data[1];
      local_3a8._0_4_ = local_380.valueMax.m_data[2];
      uStack_3a0._4_4_ = local_380.valueMax.m_data[3];
      uStack_3a0._0_4_ = local_380.valueMax.m_data[0];
      goto LAB_00346a4e;
    case 2:
      local_338 = (undefined1  [8])
                  CONCAT44(local_380.valueMin.m_data[2],local_380.valueMin.m_data[1]);
      afStack_330[1] = local_380.valueMin.m_data[3];
      afStack_330[0] = local_380.valueMin.m_data[0];
      local_3a8 = (undefined1  [8])
                  CONCAT44(local_380.valueMax.m_data[2],local_380.valueMax.m_data[1]);
      uStack_3a0._0_4_ = local_380.valueMax.m_data[0];
      uStack_3a0._4_4_ = local_380.valueMax.m_data[3];
      goto LAB_00346a89;
    case 3:
      local_3a8 = (undefined1  [8])
                  CONCAT44(local_380.valueMin.m_data[1],local_380.valueMin.m_data[0]);
      uStack_3a0._0_4_ = local_380.valueMin.m_data[2];
      local_338 = (undefined1  [8])
                  CONCAT44(local_380.valueMax.m_data[1],local_380.valueMax.m_data[0]);
      afStack_330[1] = local_380.valueMax.m_data[3];
      afStack_330[0] = local_380.valueMax.m_data[2];
      break;
    case 4:
      local_338._4_4_ = local_380.valueMax.m_data[1];
      local_338._0_4_ = local_380.valueMax.m_data[2];
      afStack_330[1] = local_380.valueMax.m_data[3];
      afStack_330[0] = local_380.valueMax.m_data[0];
      local_3a8._4_4_ = local_380.valueMin.m_data[1];
      local_3a8._0_4_ = local_380.valueMin.m_data[2];
LAB_00346a4e:
      break;
    case 5:
      local_338 = (undefined1  [8])
                  CONCAT44(local_380.valueMax.m_data[2],local_380.valueMax.m_data[1]);
      afStack_330[1] = local_380.valueMax.m_data[3];
      afStack_330[0] = local_380.valueMax.m_data[0];
      local_3a8 = (undefined1  [8])
                  CONCAT44(local_380.valueMin.m_data[2],local_380.valueMin.m_data[1]);
LAB_00346a89:
    }
    tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar4,0);
    tcu::fillWithComponentGradients
              (*(PixelBufferAccess **)((long)(this->m_texture->m_refTexture).m_data + lVar3 + -0x20)
               ,(Vec4 *)local_338,(Vec4 *)local_3a8);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
    if (uVar4 == 6) {
      glu::TextureCube::upload(this->m_texture);
      this->m_curFace = 0;
      this->m_isOk = true;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      iVar2 = std::ios_base::~ios_base(local_138);
      return iVar2;
    }
  } while( true );
}

Assistant:

void TextureCubeFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= glu::mapGLTransferFormat(m_format, m_dataType);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << getTextureFormatStr(m_format) << ", " << getTypeStr(m_dataType);
	else
		fmtName << getTextureFormatStr(m_format);

	log << TestLog::Message << "Cube map texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	DE_ASSERT(m_width == m_height);
	m_texture = m_dataType != GL_NONE
			  ? new TextureCube(m_renderCtx, m_format, m_dataType, m_width)	// Implicit internal format.
		      : new TextureCube(m_renderCtx, m_format, m_width);				// Explicit internal format.

	// Fill level 0.
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		tcu::Vec4 gMin, gMax;

		switch (face)
		{
			case 0: gMin = spec.valueMin.swizzle(0, 1, 2, 3); gMax = spec.valueMax.swizzle(0, 1, 2, 3); break;
			case 1: gMin = spec.valueMin.swizzle(2, 1, 0, 3); gMax = spec.valueMax.swizzle(2, 1, 0, 3); break;
			case 2: gMin = spec.valueMin.swizzle(1, 2, 0, 3); gMax = spec.valueMax.swizzle(1, 2, 0, 3); break;
			case 3: gMin = spec.valueMax.swizzle(0, 1, 2, 3); gMax = spec.valueMin.swizzle(0, 1, 2, 3); break;
			case 4: gMin = spec.valueMax.swizzle(2, 1, 0, 3); gMax = spec.valueMin.swizzle(2, 1, 0, 3); break;
			case 5: gMin = spec.valueMax.swizzle(1, 2, 0, 3); gMax = spec.valueMin.swizzle(1, 2, 0, 3); break;
			default:
				DE_ASSERT(false);
		}

		m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gMin, gMax);
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}